

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c++
# Opt level: O2

EncodingResult<kj::Array<char16_t>_> * __thiscall
kj::encodeUtf16(EncodingResult<kj::Array<char16_t>_> *__return_storage_ptr__,kj *this,
               ArrayPtr<const_char> text,bool nulTerminate)

{
  char *pcVar1;
  EncodingResult<kj::Array<char16_t>_> *pEVar2;
  char *pcVar3;
  bool bVar4;
  char *pcVar5;
  ulong uVar6;
  char *pcVar7;
  byte c;
  char16_t u;
  Vector<char16_t> result;
  kj local_79;
  Array<char16_t> local_78;
  uint local_60;
  ArrayBuilder<char16_t> local_58;
  EncodingResult<kj::Array<char16_t>_> *local_38;
  
  pcVar3 = text.ptr;
  local_60 = (uint)text.size_;
  uVar6 = (ulong)local_60;
  local_38 = __return_storage_ptr__;
  local_58.ptr = _::HeapArrayDisposer::allocateUninitialized<char16_t>((size_t)(pcVar3 + uVar6));
  local_58.endPtr = local_58.ptr + (long)(pcVar3 + uVar6);
  local_58.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  bVar4 = false;
  pcVar5 = (char *)0x0;
  local_58.pos = local_58.ptr;
  while( true ) {
    if (pcVar3 <= pcVar5) break;
    pcVar1 = pcVar5 + 1;
    local_79 = this[(long)pcVar5];
    if ((char)local_79 < '\0') {
      pcVar7 = pcVar1;
      if (0xbf < (byte)local_79) {
        if ((byte)local_79 < 0xe0) {
          pcVar7 = pcVar3;
          if (pcVar1 != pcVar3) {
            pcVar7 = pcVar1;
          }
        }
        else if (((byte)local_79 < 0xf0) && (pcVar7 = pcVar3, pcVar1 != pcVar3)) {
          pcVar7 = pcVar1;
        }
      }
      local_78.ptr = (char16_t *)CONCAT44(local_78.ptr._4_4_,0xfffd);
      Vector<char16_t>::add<int>((Vector<char16_t> *)&local_58,(int *)&local_78);
      pcVar5 = pcVar3;
      if (pcVar3 < pcVar7) {
        pcVar5 = pcVar7;
      }
      bVar4 = true;
      if (pcVar7 < pcVar3) {
        pcVar5 = pcVar7;
      }
    }
    else {
      Vector<char16_t>::add<unsigned_char&>((Vector<char16_t> *)&local_58,(uchar *)&local_79);
      pcVar5 = pcVar1;
    }
  }
  if ((char)local_60 != '\0') {
    local_78.ptr = (char16_t *)((ulong)local_78.ptr._4_4_ << 0x20);
    Vector<char16_t>::add<int>((Vector<char16_t> *)&local_58,(int *)&local_78);
  }
  Vector<char16_t>::releaseAsArray(&local_78,(Vector<char16_t> *)&local_58);
  pEVar2 = local_38;
  (local_38->super_Array<char16_t>).ptr = local_78.ptr;
  (local_38->super_Array<char16_t>).size_ = local_78.size_;
  (local_38->super_Array<char16_t>).disposer = local_78.disposer;
  local_78.ptr = (char16_t *)0x0;
  local_78.size_ = 0;
  local_38->hadErrors = bVar4;
  Array<char16_t>::~Array(&local_78);
  ArrayBuilder<char16_t>::dispose(&local_58);
  return pEVar2;
}

Assistant:

EncodingResult<Array<char16_t>> encodeUtf16(ArrayPtr<const char> text, bool nulTerminate) {
  return encodeUtf<char16_t>(text, nulTerminate);
}